

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

int gray_conic_to(FT_Vector *control,FT_Vector *to,gray_PWorker worker)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  
  lStack_60 = worker->y;
  lVar12 = to->x * 4;
  lVar16 = to->y * 4;
  iVar10 = worker->max_ey;
  iVar11 = (int)((ulong)lStack_60 >> 8);
  iVar14 = (int)((ulong)control->y >> 6);
  iVar2 = (int)((ulong)to->y >> 6);
  if ((iVar2 < iVar10 || (iVar14 < iVar10 || iVar11 < iVar10)) &&
     (iVar10 = worker->min_ey, iVar10 <= iVar2 || (iVar10 <= iVar14 || iVar10 <= iVar11))) {
    local_68 = worker->x;
    lVar5 = control->x * 4;
    lVar7 = control->y * 4;
    lVar13 = lVar5 - local_68;
    lStack_50 = lVar7 - lStack_60;
    uVar15 = lVar12 - (lVar5 + lVar13);
    uVar17 = lVar16 - (lVar7 + lStack_50);
    uVar6 = -uVar15;
    if (0 < (long)uVar15) {
      uVar6 = uVar15;
    }
    uVar8 = -uVar17;
    if (0 < (long)uVar17) {
      uVar8 = uVar17;
    }
    if (uVar8 < uVar6) {
      uVar8 = uVar6;
    }
    if (uVar8 < 0x41) {
      gray_render_line(worker,lVar12,lVar16);
    }
    else {
      iVar10 = -0x21;
      uVar4 = 0x20;
      do {
        uVar3 = uVar4;
        iVar2 = iVar10;
        iVar10 = iVar2 + 1;
        uVar4 = uVar3 - 2;
        bVar18 = 0x103 < uVar8;
        uVar8 = uVar8 >> 2;
      } while (bVar18);
      iVar11 = 2 << ((byte)iVar10 & 0x1f);
      if (iVar2 + 0x21U < 2) {
        bVar1 = (byte)uVar4;
        bVar9 = -(byte)iVar10;
        lVar16 = (uVar15 << (bVar1 & 0x3f)) + (lVar13 << (bVar9 & 0x3f));
        lVar12 = (uVar17 << (bVar1 & 0x3f)) + (lStack_50 << (bVar9 & 0x3f));
        local_68 = local_68 << 0x20;
        lStack_60 = lStack_60 << 0x20;
        while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
          local_68 = local_68 + lVar16;
          lStack_60 = lStack_60 + lVar12;
          lVar16 = lVar16 + (uVar15 << (bVar1 + 1 & 0x3f));
          lVar12 = lVar12 + (uVar17 << (bVar1 + 1 & 0x3f));
          gray_render_line(worker,local_68 >> 0x20,lStack_60 >> 0x20);
        }
      }
      else {
        local_58 = (uVar15 << (ulong)uVar4) + (lVar13 << (ulong)(uint)-iVar10);
        local_68 = local_68 << 0x20;
        lStack_60 = lStack_60 << 0x20;
        while (lStack_50 = uVar17 + lStack_50, bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
          local_68 = local_68 + local_58;
          lStack_60 = lStack_60 + lStack_50;
          local_58 = local_58 + (uVar15 << (ulong)(uVar3 - 1));
          gray_render_line(worker,(long)(int)((ulong)local_68 >> 0x20),
                           (long)(int)((ulong)lStack_60 >> 0x20));
        }
      }
    }
  }
  else {
    worker->x = lVar12;
    worker->y = lVar16;
  }
  return 0;
}

Assistant:

static int
  gray_conic_to( const FT_Vector*  control,
                 const FT_Vector*  to,
                 gray_PWorker      worker )
  {
    gray_render_conic( RAS_VAR_ control, to );
    return 0;
  }